

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

int __thiscall
CRegexSearcher::search
          (CRegexSearcher *this,char *entirestr,char *str,size_t len,
          re_compiled_pattern_base *pattern,re_tuple_conflict *tuple_arr,re_machine *machine,
          re_group_register_conflict *regs,int *result_len)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long in_RCX;
  char *in_RDX;
  long in_RSI;
  long in_R8;
  bool bVar4;
  size_t *in_stack_00000010;
  int *in_stack_00000018;
  int end_idx;
  int keep;
  int matchlen;
  utf8_ptr p;
  size_t entirelen;
  char *max_start_pos;
  int best_match_start;
  int best_match_len;
  short loop_vars [20];
  re_compiled_pattern_base *in_stack_00000098;
  re_group_register_conflict best_match_regs [10];
  re_group_register_conflict *in_stack_000000f0;
  size_t *rem;
  utf8_ptr *this_00;
  utf8_ptr local_e8;
  char *local_e0;
  char *local_d8;
  int local_d0;
  int local_cc;
  utf8_ptr local_c8 [6];
  undefined1 local_98 [96];
  long local_38;
  char *local_28;
  int local_c;
  
  local_cc = -1;
  local_d0 = -1;
  local_d8 = in_RDX + in_RCX;
  local_e0 = in_RDX + (in_RCX - in_RSI);
  local_38 = in_R8;
  local_28 = in_RDX;
  utf8_ptr::utf8_ptr(&local_e8);
  utf8_ptr::set(&local_e8,local_28);
  while( true ) {
    utf8_ptr::getptr(&local_e8);
    this_00 = local_c8;
    rem = in_stack_00000010;
    iVar1 = match((CRegexSearcher *)best_match_regs[4],(char *)best_match_regs[3],
                  (size_t)best_match_regs[2],(char *)best_match_regs[1],(size_t)best_match_regs[0],
                  in_stack_00000098,(re_tuple_conflict *)best_match_regs[8],
                  (re_machine *)best_match_regs[9],in_stack_000000f0,(short *)tuple_arr);
    if (-1 < iVar1) {
      if ((*(byte *)(local_38 + 0x14) >> 3 & 1) != 0) {
        *in_stack_00000018 = iVar1;
        pcVar3 = utf8_ptr::getptr(&local_e8);
        return (int)pcVar3 - (int)local_28;
      }
      if (local_cc == -1) {
        bVar4 = true;
      }
      else {
        pcVar3 = utf8_ptr::getptr(&local_e8);
        iVar2 = ((int)pcVar3 - (int)local_28) + iVar1;
        if (iVar2 < local_d0 + local_cc) {
          bVar4 = true;
        }
        else if (iVar2 == local_d0 + local_cc) {
          bVar4 = (*(byte *)(local_38 + 0x14) >> 2 & 1) == 0;
        }
        else {
          bVar4 = false;
        }
      }
      if (bVar4) {
        pcVar3 = utf8_ptr::getptr(&local_e8);
        local_d0 = (int)pcVar3 - (int)local_28;
        local_cc = iVar1;
        memcpy(local_98,in_stack_00000010,0x50);
        local_d8 = utf8_ptr::getptr(&local_e8);
        local_d8 = local_d8 + iVar1;
      }
    }
    pcVar3 = utf8_ptr::getptr(&local_e8);
    if (pcVar3 == local_d8) break;
    utf8_ptr::inc(this_00,rem);
  }
  if (local_cc == -1) {
    local_c = -1;
  }
  else {
    *in_stack_00000018 = local_cc;
    memcpy(in_stack_00000010,local_98,0x50);
    local_c = local_d0;
  }
  return local_c;
}

Assistant:

int CRegexSearcher::search(const char *entirestr, const char *str, size_t len,
                           const re_compiled_pattern_base *pattern,
                           const re_tuple *tuple_arr,
                           const re_machine *machine, re_group_register *regs,
                           int *result_len)
{
    re_group_register best_match_regs[RE_GROUP_REG_CNT];
    short loop_vars[RE_LOOP_VARS_MAX];

    /* we don't have a match yet */
    int best_match_len = -1;
    int best_match_start = -1;

    /* search the entire string */
    const char *max_start_pos = str + len;

    /* figure the length of the overall string */
    size_t entirelen = len + (str - entirestr);
    
    /*
     *   Starting at the first character in the string, search for the
     *   pattern at each subsequent character until we either find the
     *   pattern or run out of string to test. 
     */
    utf8_ptr p;
    for (p.set((char *)str) ; ; )
    {
        /* check for a match */
        int matchlen = match(entirestr, entirelen, p.getptr(), len,
                             pattern, tuple_arr, machine, regs, loop_vars);
        if (matchlen >= 0)
        {
            /* check our first-begin/first-end mode */
            if (pattern->first_begin)
            {
                /*   
                 *   We're in first-begin mode: return immediately,
                 *   because we want to find the match that starts at the
                 *   earliest point in the string; having found a match
                 *   here, there's no point in looking for a later match,
                 *   since it obviously won't start any earlier than this
                 *   one does.  
                 */
                *result_len = matchlen;
                return p.getptr() - str;
            }
            else
            {
                int keep;
                
                /*
                 *   We're in first-end mode.  We can't return yet,
                 *   because we might find something that ends before this
                 *   string does.
                 *   
                 *   If this is the first or best match so far, note it;
                 *   otherwise, ignore it.  In any case, continue looking.
                 */
                if (best_match_len == -1)
                {
                    /* 
                     *   this is our first match - it's definitely the
                     *   best so far 
                     */
                    keep = TRUE;
                }
                else
                {
                    /* calculate the ending index of this match */
                    int end_idx = (p.getptr() - str) + matchlen;

                    /* see what we have */
                    if (end_idx < best_match_start + best_match_len)
                    {
                        /* 
                         *   this one ends earlier than the previous best
                         *   match so far -- we definitely want to keep
                         *   this one 
                         */
                        keep = TRUE;
                    }
                    else if (end_idx == best_match_start + best_match_len)
                    {
                        /* 
                         *   This one ends at exactly the same point as
                         *   our best match so far.  Decide which one to
                         *   keep based on the lengths.  If we're in
                         *   longest-match mode, keep the longer one,
                         *   otherwise keep the shorter one. 
                         */
                        if (pattern->longest_match)
                        {
                            /* 
                             *   longest-match mode - keep the old one,
                             *   since it's longer (it starts earlier and
                             *   ends at the same point) 
                             */
                            keep = FALSE;
                        }
                        else
                        {
                            /* 
                             *   shortest-match mode - keep the new one,
                             *   since it's shorter (it starts later and
                             *   ends at the same point) 
                             */
                            keep = TRUE;
                        }
                    }
                    else
                    {
                        /* 
                         *   this one isn't as good as the previous best
                         *   -- ignore this one and keep our previous
                         *   winner 
                         */
                        keep = FALSE;
                    }
                }
                
                /* if we're keeping this match, save it */
                if (keep)
                {
                    /* save the start index, length, and register contents */
                    best_match_start = p.getptr() - str;
                    best_match_len = matchlen;
                    memcpy(best_match_regs, regs, sizeof(best_match_regs));

                    /*
                     *   There's no point in looking for strings that
                     *   start beyond the end of the current match,
                     *   because they certainly won't end before this
                     *   match ends.  So, adjust our end-of-loop marker to
                     *   point to the next character past the end of our
                     *   match. 
                     */
                    max_start_pos = p.getptr() + matchlen;
                }
            }
		}

		/* stop if we've reached the end of the string */
		if (p.getptr() == max_start_pos)
			break;

		/* advance by one character and try again */
		p.inc(&len);
	}

    /* if we found a previous match, return it */
    if (best_match_len != -1)
    {
        /* set the caller's match length */
        *result_len = best_match_len;

        /* copy the saved match registers into the caller's registers */
        memcpy(regs, best_match_regs, sizeof(best_match_regs));

        /* return the starting index of the match */
        return best_match_start;
    }

    /* we didn't find a match */
    return -1;
}